

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_tetgen_node(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  FILE *pFVar7;
  long lVar8;
  undefined8 uVar9;
  REF_STATUS RVar10;
  REF_LONG ref_private_status_reis_ai;
  ulong uVar11;
  char *pcVar12;
  size_t __n;
  REF_INT item;
  REF_INT mark;
  REF_INT nnode;
  REF_INT id;
  REF_INT ntri;
  REF_INT new_node;
  REF_INT attr;
  REF_INT ndim;
  REF_DBL xyz [3];
  REF_INT new_cell;
  REF_INT nodes [27];
  char project [1000];
  char othername [1024];
  uint local_8d8;
  int local_8d4;
  int local_8d0;
  undefined4 local_8cc;
  int local_8c8;
  uint local_8c4;
  int local_8c0;
  int local_8bc;
  REF_DBL local_8b8;
  REF_DBL local_8b0;
  REF_DBL local_8a8;
  REF_INT local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined4 local_88c;
  undefined1 local_828 [1008];
  char local_438 [1032];
  
  sVar6 = strlen(filename);
  __n = 0x3fa;
  if (sVar6 < 0x400) {
    __n = sVar6 - 5;
  }
  iVar3 = strncmp(filename + __n,".node",5);
  if (iVar3 == 0) {
    memcpy(local_828,filename,__n);
    local_828[__n] = 0;
    uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x4cb,"ref_import_tetgen_node",(ulong)uVar4,"create grid");
      return uVar4;
    }
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pFVar7 = fopen(filename,"r");
    if (pFVar7 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      uVar9 = 0x4d1;
    }
    else {
      iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d0);
      if (iVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d3,"ref_import_tetgen_node","node header nnode",1,(long)iVar3);
        return 1;
      }
      iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8bc);
      if (iVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d4,"ref_import_tetgen_node","node header ndim",1,(long)iVar3);
        return 1;
      }
      if ((long)local_8bc != 3) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d5,"ref_import_tetgen_node","not 3D",3,(long)local_8bc);
      }
      if (local_8bc != 3) {
        return 1;
      }
      iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8c0);
      if (iVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d6,"ref_import_tetgen_node","node header attr",1,(long)iVar3);
        return 1;
      }
      if ((long)local_8c0 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d7,"ref_import_tetgen_node","nodes have attribute 3D",0,(long)local_8c0);
      }
      if (local_8c0 != 0) {
        return 1;
      }
      iVar5 = __isoc99_fscanf(pFVar7,"%d",&local_8d4);
      iVar3 = local_8d4;
      if (iVar5 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d8,"ref_import_tetgen_node","node header mark",1,(long)iVar5);
        return 1;
      }
      if ((long)local_8d4 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4d9,"ref_import_tetgen_node","nodes have mark",0,(long)local_8d4);
      }
      if (iVar3 != 0) {
        return 1;
      }
      if (0 < local_8d0) {
        uVar11 = 0;
        while( true ) {
          iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d8);
          if (iVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x4dc,"ref_import_tetgen_node","node item",1,(long)iVar3);
            return 1;
          }
          if (uVar11 != local_8d8) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x4dd,"ref_import_tetgen_node","file node index",uVar11,(long)(int)local_8d8);
            return 1;
          }
          uVar4 = ref_node_add(ref_node,uVar11,(REF_INT *)&local_8c4);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x4de,"ref_import_tetgen_node",(ulong)uVar4,"add node");
            return uVar4;
          }
          if (uVar11 != local_8c4) break;
          iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8b8);
          if (iVar3 != 1) {
            pcVar12 = "x";
            uVar9 = 0x4e0;
            goto LAB_001ccba9;
          }
          iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8b0);
          if (iVar3 != 1) {
            pcVar12 = "y";
            uVar9 = 0x4e1;
            goto LAB_001ccba9;
          }
          iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8a8);
          if (iVar3 != 1) {
            pcVar12 = "z";
            uVar9 = 0x4e2;
            goto LAB_001ccba9;
          }
          pRVar2 = ref_node->real;
          lVar8 = (long)(int)local_8c4;
          pRVar2[lVar8 * 0xf] = local_8b8;
          pRVar2[lVar8 * 0xf + 1] = local_8b0;
          pRVar2[lVar8 * 0xf + 2] = local_8a8;
          uVar11 = uVar11 + 1;
          if ((long)local_8d0 <= (long)uVar11) goto LAB_001cc7a3;
        }
        pcVar12 = "node index";
        uVar9 = 0x4df;
LAB_001ccba9:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar9,"ref_import_tetgen_node",pcVar12);
        goto LAB_001cc2fa;
      }
LAB_001cc7a3:
      fclose(pFVar7);
      uVar4 = ref_node_initialize_n_global(ref_node,(long)local_8d0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x4e9,"ref_import_tetgen_node",(ulong)uVar4,"init glob");
        return uVar4;
      }
      snprintf(local_438,0x3fb,"%s.face",local_828);
      pFVar7 = fopen(local_438,"r");
      if (pFVar7 != (FILE *)0x0) {
        iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8c8);
        if (iVar3 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x4ef,"ref_import_tetgen_node","face header ntri",1,(long)iVar3);
          return 1;
        }
        iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d4);
        if (iVar3 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x4f0,"ref_import_tetgen_node","face header mark",1,(long)iVar3);
          return 1;
        }
        if (0 < local_8c8) {
          ref_cell = pRVar1->cell[3];
          uVar11 = 0;
          do {
            iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d8);
            if (iVar3 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x4f4,"ref_import_tetgen_node","read tri item",1,(long)iVar3);
              return 1;
            }
            if (uVar11 != local_8d8) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x4f5,"ref_import_tetgen_node","tri index",uVar11,(long)(int)local_8d8);
              return 1;
            }
            lVar8 = 0;
            do {
              iVar3 = __isoc99_fscanf(pFVar7,"%d",(long)&local_898 + lVar8);
              if (iVar3 != 1) {
                pcVar12 = "tri";
                uVar9 = 0x4f7;
                goto LAB_001ccba9;
              }
              lVar8 = lVar8 + 4;
            } while (lVar8 != 0xc);
            local_8cc = 0;
            if ((local_8d4 == 1) && (iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8cc), iVar3 != 1)) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x4f9,"ref_import_tetgen_node","tri mark id",1,(long)iVar3);
              return 1;
            }
            local_88c = local_8cc;
            printf("cell %d: %d %d %d %d\n",uVar11 & 0xffffffff,(ulong)local_898,(ulong)local_894,
                   (ulong)local_890);
            uVar4 = ref_cell_add(ref_cell,(REF_INT *)&local_898,&local_89c);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x4fd,"ref_import_tetgen_node",(ulong)uVar4,"tri face for tri");
              return uVar4;
            }
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)local_8c8);
        }
        fclose(pFVar7);
        return 0;
      }
      printf("unable to open %s\n",local_438);
      uVar9 = 0x4ee;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar9,
           "ref_import_tetgen_node","unable to open file");
    RVar10 = 2;
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x4c5,
           "ref_import_tetgen_node","filename does not end in .node",0,(long)iVar3);
LAB_001cc2fa:
    RVar10 = 1;
  }
  return RVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_import_tetgen_node(REF_GRID *ref_grid_ptr,
                                                 REF_MPI ref_mpi,
                                                 const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char project[1000], othername[1024];
  REF_INT nnode, ndim, attr, mark, node, item, new_node;
  REF_INT ntri, new_cell, cell, id, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3];
  size_t end_of_string;
  end_of_string = MIN(1023, strlen(filename));

  REIS(0, strncmp(&filename[end_of_string - 5], ".node", 5),
       "filename does not end in .node");

  RAS(end_of_string < 1024, "filename too long for temp string");
  memcpy(project, filename, end_of_string - 5);
  project[end_of_string - 5] = '\0';

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  for (node = 0; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }
  fclose(file);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  snprintf(othername, 1019, "%s.face", project);
  file = fopen(othername, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", othername);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");

  ref_cell = ref_grid_tri(ref_grid);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "read tri item");
    REIS(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    id = 0;
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    nodes[3] = id;
    printf("cell %d: %d %d %d %d\n", cell, nodes[0], nodes[1], nodes[2],
           nodes[3]);
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "tri face for tri");
  }

  fclose(file);

  return REF_SUCCESS;
}